

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall Qclass_noplot_Test::TestBody(Qclass_noplot_Test *this)

{
  bool bVar1;
  char *message;
  Qclass QStack_15fe8;
  internal local_30 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  memset(QStack_15fe8.grid,0,10000);
  memset(QStack_15fe8.Q,0,0x13881);
  remove("Obstacles1.txt");
  local_18.ptr_._0_4_ = Qclass::plot(&QStack_15fe8);
  gtest_ar.message_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"Test.plot()","0",(int *)&local_18,(int *)&gtest_ar.message_);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x4d,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Qclass::~Qclass(&QStack_15fe8);
  return;
}

Assistant:

TEST(Qclass, noplot) {
  Qclass Test;
  remove("Obstacles1.txt");
  EXPECT_EQ(Test.plot(), 0);
}